

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  xmlChar *pxVar6;
  int iVar7;
  xmlChar *local_70;
  xmlChar *httpequiv;
  xmlOutputBufferPtr pxStack_60;
  int res;
  xmlOutputBufferPtr buf;
  xmlChar *end;
  xmlChar *start;
  xmlNodePtr parent;
  xmlNodePtr unformattedNode;
  xmlNodePtr root;
  xmlNodePtr tmp;
  int local_20;
  int oldoptions;
  int addmeta;
  int format;
  xmlNodePtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  oldoptions = ctxt->format;
  parent = (xmlNodePtr)0x0;
  pxStack_60 = ctxt->buf;
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  tmp._4_4_ = ctxt->options;
  ctxt->options = ctxt->options | 0x10;
  start = (xmlChar *)cur->parent;
  unformattedNode = cur;
  _addmeta = (xmlDocPtr)cur;
  cur_local = (xmlNodePtr)ctxt;
LAB_0019d645:
  switch(_addmeta->type) {
  case XML_ELEMENT_NODE:
    local_20 = 0;
    if ((_addmeta != (xmlDocPtr)unformattedNode) && (*(int *)&cur_local->last == 1)) {
      xmlSaveWriteIndent((xmlSaveCtxtPtr)cur_local,0);
    }
    if ((_addmeta->parent == (_xmlNode *)start) || (_addmeta->children == (_xmlNode *)0x0)) {
      xmlOutputBufferWrite(pxStack_60,1,"<");
      lVar2._0_4_ = _addmeta->compression;
      lVar2._4_4_ = _addmeta->standalone;
      if ((lVar2 != 0) && (*(long *)(*(long *)&_addmeta->compression + 0x18) != 0)) {
        xmlOutputBufferWriteString(pxStack_60,*(char **)(*(long *)&_addmeta->compression + 0x18));
        xmlOutputBufferWrite(pxStack_60,1,":");
      }
      xmlOutputBufferWriteString(pxStack_60,_addmeta->name);
      if (_addmeta->oldNs != (_xmlNs *)0x0) {
        xmlNsListDumpOutputCtxt((xmlSaveCtxtPtr)cur_local,_addmeta->oldNs);
      }
      iVar7 = xmlStrEqual((xmlChar *)_addmeta->name,"html");
      if (((iVar7 != 0) &&
          (lVar3._0_4_ = _addmeta->compression, lVar3._4_4_ = _addmeta->standalone, lVar3 == 0)) &&
         (_addmeta->oldNs == (_xmlNs *)0x0)) {
        xmlOutputBufferWriteString(pxStack_60," xmlns=\"http://www.w3.org/1999/xhtml\"");
      }
      if (_addmeta->extSubset != (_xmlDtd *)0x0) {
        xhtmlAttrListDumpOutput((xmlSaveCtxtPtr)cur_local,(xmlAttrPtr)_addmeta->extSubset);
      }
      if (((start != (xmlChar *)0x0) && (*(_xmlDoc **)(start + 0x28) == _addmeta->doc)) &&
         ((iVar7 = xmlStrEqual((xmlChar *)_addmeta->name,"head"), iVar7 != 0 &&
          (iVar7 = xmlStrEqual(*(xmlChar **)(start + 0x10),"html"), iVar7 != 0)))) {
        for (root = _addmeta->children; root != (xmlNodePtr)0x0; root = root->next) {
          iVar7 = xmlStrEqual(root->name,(xmlChar *)"meta");
          if (iVar7 != 0) {
            httpequiv._4_4_ =
                 xmlNodeGetAttrValue(root,(xmlChar *)"http-equiv",(xmlChar *)0x0,&local_70);
            if (httpequiv._4_4_ < 0) {
              xmlSaveErrMemory(pxStack_60);
            }
            else if (httpequiv._4_4_ == 0) {
              iVar7 = xmlStrcasecmp(local_70,(xmlChar *)"Content-Type");
              if (iVar7 == 0) {
                (*xmlFree)(local_70);
                break;
              }
              (*xmlFree)(local_70);
            }
          }
        }
        if (root == (xmlNodePtr)0x0) {
          local_20 = 1;
        }
      }
      if (_addmeta->children != (_xmlNode *)0x0) {
        xmlOutputBufferWrite(pxStack_60,1,">");
        if (local_20 == 1) {
          if (*(int *)&cur_local->last == 1) {
            xmlOutputBufferWrite(pxStack_60,1,"\n");
            xmlSaveWriteIndent((xmlSaveCtxtPtr)cur_local,1);
          }
          xmlOutputBufferWriteString
                    (pxStack_60,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
          if (cur_local->_private == (void *)0x0) {
            xmlOutputBufferWrite(pxStack_60,5,"UTF-8");
          }
          else {
            xmlOutputBufferWriteString(pxStack_60,(char *)cur_local->_private);
          }
          xmlOutputBufferWrite(pxStack_60,4,"\" />");
        }
        if (*(int *)&cur_local->last == 1) {
          for (root = _addmeta->children; root != (xmlNodePtr)0x0; root = root->next) {
            if ((root->type == XML_TEXT_NODE) || (root->type == XML_ENTITY_REF_NODE)) {
              parent = (xmlNodePtr)_addmeta;
              *(undefined4 *)&cur_local->last = 0;
              break;
            }
          }
        }
        if (*(int *)&cur_local->last == 1) {
          xmlOutputBufferWrite(pxStack_60,1,"\n");
        }
        if (-1 < *(int *)((long)&cur_local->children + 4)) {
          *(int *)((long)&cur_local->children + 4) = *(int *)((long)&cur_local->children + 4) + 1;
        }
        start = (xmlChar *)_addmeta;
        _addmeta = (xmlDocPtr)_addmeta->children;
        goto LAB_0019d645;
      }
      lVar4._0_4_ = _addmeta->compression;
      lVar4._4_4_ = _addmeta->standalone;
      if ((((lVar4 == 0) || (*(long *)(*(long *)&_addmeta->compression + 0x18) == 0)) &&
          (iVar7 = xhtmlIsEmpty((xmlNodePtr)_addmeta), iVar7 == 1)) && (local_20 == 0)) {
        xmlOutputBufferWrite(pxStack_60,3," />");
      }
      else {
        if (local_20 == 1) {
          xmlOutputBufferWrite(pxStack_60,1,">");
          if (*(int *)&cur_local->last == 1) {
            xmlOutputBufferWrite(pxStack_60,1,"\n");
            xmlSaveWriteIndent((xmlSaveCtxtPtr)cur_local,1);
          }
          xmlOutputBufferWriteString
                    (pxStack_60,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
          if (cur_local->_private == (void *)0x0) {
            xmlOutputBufferWrite(pxStack_60,5,"UTF-8");
          }
          else {
            xmlOutputBufferWriteString(pxStack_60,(char *)cur_local->_private);
          }
          xmlOutputBufferWrite(pxStack_60,4,"\" />");
          if (*(int *)&cur_local->last == 1) {
            xmlOutputBufferWrite(pxStack_60,1,"\n");
          }
        }
        else {
          xmlOutputBufferWrite(pxStack_60,1,">");
        }
        xmlOutputBufferWrite(pxStack_60,2,"</");
        if ((*(xmlNs **)&_addmeta->compression != (xmlNs *)0x0) &&
           ((*(xmlNs **)&_addmeta->compression)->prefix != (xmlChar *)0x0)) {
          xmlOutputBufferWriteString(pxStack_60,(char *)(*(xmlNs **)&_addmeta->compression)->prefix)
          ;
          xmlOutputBufferWrite(pxStack_60,1,":");
        }
        xmlOutputBufferWriteString(pxStack_60,_addmeta->name);
        xmlOutputBufferWrite(pxStack_60,1,">");
      }
    }
    else {
      xhtmlNodeDumpOutput((xmlSaveCtxtPtr)cur_local,(xmlNodePtr)_addmeta);
    }
    break;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput((xmlSaveCtxtPtr)cur_local,(xmlAttrPtr)_addmeta);
    break;
  case XML_TEXT_NODE:
    if (_addmeta->intSubset != (_xmlDtd *)0x0) {
      if (((xmlChar *)_addmeta->name == "text") || ((xmlChar *)_addmeta->name != "textnoenc")) {
        lVar5._0_2_ = cur_local->line;
        lVar5._2_2_ = cur_local->extra;
        lVar5._4_4_ = *(undefined4 *)&cur_local->field_0x74;
        if (lVar5 == 0) {
          xmlSaveWriteText((xmlSaveCtxt *)cur_local,(xmlChar *)_addmeta->intSubset,0);
        }
        else {
          xmlOutputBufferWriteEscape
                    (pxStack_60,(xmlChar *)_addmeta->intSubset,
                     *(xmlCharEncodingOutputFunc *)&cur_local->line);
        }
      }
      else {
        xmlOutputBufferWriteString(pxStack_60,(char *)_addmeta->intSubset);
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if ((_addmeta->intSubset == (_xmlDtd *)0x0) || (*(char *)&_addmeta->intSubset->_private == '\0')
       ) {
      xmlOutputBufferWrite(pxStack_60,0xc,"<![CDATA[]]>");
    }
    else {
      buf = (xmlOutputBufferPtr)_addmeta->intSubset;
      end = (xmlChar *)buf;
      for (; *(char *)&buf->context != '\0'; buf = (xmlOutputBufferPtr)((long)&buf->context + 1)) {
        if (((*(char *)&buf->context == ']') && (*(char *)((long)&buf->context + 1) == ']')) &&
           (*(char *)((long)&buf->context + 2) == '>')) {
          buf = (xmlOutputBufferPtr)((long)&buf->context + 2);
          xmlOutputBufferWrite(pxStack_60,9,"<![CDATA[");
          xmlOutputBufferWrite(pxStack_60,(int)buf - (int)end,(char *)end);
          xmlOutputBufferWrite(pxStack_60,3,"]]>");
          end = (xmlChar *)buf;
        }
      }
      if ((xmlOutputBufferPtr)end != buf) {
        xmlOutputBufferWrite(pxStack_60,9,"<![CDATA[");
        xmlOutputBufferWriteString(pxStack_60,(char *)end);
        xmlOutputBufferWrite(pxStack_60,3,"]]>");
      }
    }
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWrite(pxStack_60,1,"&");
    xmlOutputBufferWriteString(pxStack_60,_addmeta->name);
    xmlOutputBufferWrite(pxStack_60,1,";");
    break;
  default:
    break;
  case XML_PI_NODE:
    if (_addmeta->intSubset == (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(pxStack_60,2,"<?");
      xmlOutputBufferWriteString(pxStack_60,_addmeta->name);
      xmlOutputBufferWrite(pxStack_60,2,"?>");
    }
    else {
      xmlOutputBufferWrite(pxStack_60,2,"<?");
      xmlOutputBufferWriteString(pxStack_60,_addmeta->name);
      if (_addmeta->intSubset != (_xmlDtd *)0x0) {
        xmlOutputBufferWrite(pxStack_60,1," ");
        xmlOutputBufferWriteString(pxStack_60,(char *)_addmeta->intSubset);
      }
      xmlOutputBufferWrite(pxStack_60,2,"?>");
    }
    break;
  case XML_COMMENT_NODE:
    if (_addmeta->intSubset != (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(pxStack_60,4,"<!--");
      xmlOutputBufferWriteString(pxStack_60,(char *)_addmeta->intSubset);
      xmlOutputBufferWrite(pxStack_60,3,"-->");
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlSaveDocInternal((xmlSaveCtxtPtr)cur_local,_addmeta,(xmlChar *)cur_local->_private);
    break;
  case XML_DOCUMENT_FRAG_NODE:
    if ((_addmeta->parent != (_xmlNode *)start) || (_addmeta->children == (_xmlNode *)0x0)) break;
    start = (xmlChar *)_addmeta;
    _addmeta = (xmlDocPtr)_addmeta->children;
    goto LAB_0019d645;
  case XML_DTD_NODE:
    xmlDtdDumpOutput((xmlSaveCtxtPtr)cur_local,(xmlDtdPtr)_addmeta);
    break;
  case XML_ELEMENT_DECL:
    xmlBufDumpElementDecl(pxStack_60,(xmlElementPtr)_addmeta);
    break;
  case XML_ATTRIBUTE_DECL:
    xmlBufDumpAttributeDecl(pxStack_60,(xmlAttributePtr)_addmeta);
    break;
  case XML_ENTITY_DECL:
    xmlBufDumpEntityDecl(pxStack_60,(xmlEntityPtr)_addmeta);
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutput(pxStack_60,(xmlNsPtr)_addmeta,(xmlSaveCtxtPtr)cur_local);
  }
  while( true ) {
    if (_addmeta == (xmlDocPtr)unformattedNode) {
      return;
    }
    if (*(int *)&cur_local->last == 1) {
      xmlOutputBufferWrite(pxStack_60,1,"\n");
    }
    if (_addmeta->next != (_xmlNode *)0x0) break;
    _addmeta = (xmlDocPtr)start;
    pxVar6 = *(xmlChar **)(start + 0x28);
    piVar1 = (int *)(start + 8);
    start = pxVar6;
    if (*piVar1 == 1) {
      if (0 < *(int *)((long)&cur_local->children + 4)) {
        *(int *)((long)&cur_local->children + 4) = *(int *)((long)&cur_local->children + 4) + -1;
      }
      if (*(int *)&cur_local->last == 1) {
        xmlSaveWriteIndent((xmlSaveCtxtPtr)cur_local,0);
      }
      xmlOutputBufferWrite(pxStack_60,2,"</");
      if ((*(xmlNs **)&_addmeta->compression != (xmlNs *)0x0) &&
         ((*(xmlNs **)&_addmeta->compression)->prefix != (xmlChar *)0x0)) {
        xmlOutputBufferWriteString(pxStack_60,(char *)(*(xmlNs **)&_addmeta->compression)->prefix);
        xmlOutputBufferWrite(pxStack_60,1,":");
      }
      xmlOutputBufferWriteString(pxStack_60,_addmeta->name);
      xmlOutputBufferWrite(pxStack_60,1,">");
      if (_addmeta == (xmlDocPtr)parent) {
        *(int *)&cur_local->last = oldoptions;
        parent = (xmlNodePtr)0x0;
      }
    }
  }
  _addmeta = (xmlDocPtr)_addmeta->next;
  goto LAB_0019d645;
}

Assistant:

static void
xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format, addmeta, oldoptions;
    xmlNodePtr tmp, root, unformattedNode = NULL, parent;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf = ctxt->buf;

    if (cur == NULL) return;

    oldoptions = ctxt->options;
    ctxt->options |= XML_SAVE_XHTML;

    root = cur;
    parent = cur->parent;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            xmlSaveDocInternal(ctxt, (xmlDocPtr) cur, ctxt->encoding);
	    break;

        case XML_NAMESPACE_DECL:
	    xmlNsDumpOutput(buf, (xmlNsPtr) cur, ctxt);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
	    break;

        case XML_DOCUMENT_FRAG_NODE:
            /* Always validate cur->parent when descending. */
            if ((cur->parent == parent) && (cur->children != NULL)) {
                parent = cur;
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_DECL:
            xmlBufDumpElementDecl(buf, (xmlElementPtr) cur);
	    break;

        case XML_ATTRIBUTE_DECL:
            xmlBufDumpAttributeDecl(buf, (xmlAttributePtr) cur);
	    break;

        case XML_ENTITY_DECL:
            xmlBufDumpEntityDecl(buf, (xmlEntityPtr) cur);
	    break;

        case XML_ELEMENT_NODE:
            addmeta = 0;

	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            /*
             * Some users like lxml are known to pass nodes with a corrupted
             * tree structure. Fall back to a recursive call to handle this
             * case.
             */
            if ((cur->parent != parent) && (cur->children != NULL)) {
                xhtmlNodeDumpOutput(ctxt, cur);
                break;
            }

            xmlOutputBufferWrite(buf, 1, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }

            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            if ((xmlStrEqual(cur->name, BAD_CAST "html") &&
                (cur->ns == NULL) && (cur->nsDef == NULL))) {
                /*
                 * 3.1.1. Strictly Conforming Documents A.3.1.1 3/
                 */
                xmlOutputBufferWriteString(buf,
                        " xmlns=\"http://www.w3.org/1999/xhtml\"");
            }
            if (cur->properties != NULL)
                xhtmlAttrListDumpOutput(ctxt, cur->properties);

            if ((parent != NULL) &&
                (parent->parent == (xmlNodePtr) cur->doc) &&
                xmlStrEqual(cur->name, BAD_CAST"head") &&
                xmlStrEqual(parent->name, BAD_CAST"html")) {

                tmp = cur->children;
                while (tmp != NULL) {
                    if (xmlStrEqual(tmp->name, BAD_CAST"meta")) {
                        int res;
                        xmlChar *httpequiv;

                        res = xmlNodeGetAttrValue(tmp, BAD_CAST "http-equiv",
                                                  NULL, &httpequiv);
                        if (res < 0) {
                            xmlSaveErrMemory(buf);
                        } else if (res == 0) {
                            if (xmlStrcasecmp(httpequiv,
                                        BAD_CAST"Content-Type") == 0) {
                                xmlFree(httpequiv);
                                break;
                            }
                            xmlFree(httpequiv);
                        }
                    }
                    tmp = tmp->next;
                }
                if (tmp == NULL)
                    addmeta = 1;
            }

            if (cur->children == NULL) {
                if (((cur->ns == NULL) || (cur->ns->prefix == NULL)) &&
                    ((xhtmlIsEmpty(cur) == 1) && (addmeta == 0))) {
                    /*
                     * C.2. Empty Elements
                     */
                    xmlOutputBufferWrite(buf, 3, " />");
                } else {
                    if (addmeta == 1) {
                        xmlOutputBufferWrite(buf, 1, ">");
                        if (ctxt->format == 1) {
                            xmlOutputBufferWrite(buf, 1, "\n");
                            xmlSaveWriteIndent(ctxt, 1);
                        }
                        xmlOutputBufferWriteString(buf,
                                "<meta http-equiv=\"Content-Type\" "
                                "content=\"text/html; charset=");
                        if (ctxt->encoding) {
                            xmlOutputBufferWriteString(buf,
                                    (const char *)ctxt->encoding);
                        } else {
                            xmlOutputBufferWrite(buf, 5, "UTF-8");
                        }
                        xmlOutputBufferWrite(buf, 4, "\" />");
                        if (ctxt->format == 1)
                            xmlOutputBufferWrite(buf, 1, "\n");
                    } else {
                        xmlOutputBufferWrite(buf, 1, ">");
                    }
                    /*
                     * C.3. Element Minimization and Empty Element Content
                     */
                    xmlOutputBufferWrite(buf, 2, "</");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWrite(buf, 1, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWrite(buf, 1, ">");
                }
            } else {
                xmlOutputBufferWrite(buf, 1, ">");
                if (addmeta == 1) {
                    if (ctxt->format == 1) {
                        xmlOutputBufferWrite(buf, 1, "\n");
                        xmlSaveWriteIndent(ctxt, 1);
                    }
                    xmlOutputBufferWriteString(buf,
                            "<meta http-equiv=\"Content-Type\" "
                            "content=\"text/html; charset=");
                    if (ctxt->encoding) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)ctxt->encoding);
                    } else {
                        xmlOutputBufferWrite(buf, 5, "UTF-8");
                    }
                    xmlOutputBufferWrite(buf, 4, "\" />");
                }

                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            unformattedNode = cur;
                            ctxt->format = 0;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }

                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                parent = cur;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (cur->content == NULL)
                break;
	    if ((cur->name == xmlStringText) ||
		(cur->name != xmlStringTextNoenc)) {
                if (ctxt->escape)
                    xmlOutputBufferWriteEscape(buf, cur->content,
                                               ctxt->escape);
                else
                    xmlSaveWriteText(ctxt, cur->content, /* flags */ 0);
	    } else {
		/*
		 * Disable escaping, needed for XSLT
		 */
		xmlOutputBufferWriteString(buf, (const char *) cur->content);
	    }
	    break;

        case XML_PI_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 4, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWrite(buf, 3, "-->");
            }
            break;

        case XML_ENTITY_REF_NODE:
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
            break;

        case XML_CDATA_SECTION_NODE:
            if (cur->content == NULL || *cur->content == '\0') {
                xmlOutputBufferWrite(buf, 12, "<![CDATA[]]>");
            } else {
                start = end = cur->content;
                while (*end != '\0') {
                    if (*end == ']' && *(end + 1) == ']' &&
                        *(end + 2) == '>') {
                        end = end + 2;
                        xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                        xmlOutputBufferWrite(buf, end - start,
                                (const char *)start);
                        xmlOutputBufferWrite(buf, 3, "]]>");
                        start = end;
                    }
                    end++;
                }
                if (start != end) {
                    xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                    xmlOutputBufferWriteString(buf, (const char *)start);
                    xmlOutputBufferWrite(buf, 3, "]]>");
                }
            }
            break;

        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
	    break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (ctxt->format == 1)
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            cur = parent;
            /* cur->parent was validated when descending. */
            parent = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if (ctxt->format == 1)
                    xmlSaveWriteIndent(ctxt, 0);

                xmlOutputBufferWrite(buf, 2, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->ns->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }

                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 1, ">");

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }

    ctxt->options = oldoptions;
}